

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O0

int arkRootfind(void *arkode_mem)

{
  double *pdVar1;
  undefined8 *puVar2;
  bool bVar3;
  undefined4 uVar4;
  long in_RDI;
  double dVar5;
  ARKodeRootMem rootmem;
  ARKodeMem ark_mem;
  int sgnchg;
  int zroot;
  int sideprev;
  int side;
  int imax;
  int retval;
  int i;
  sunrealtype fracsub;
  sunrealtype fracint;
  sunrealtype maxfrac;
  sunrealtype gfrac;
  sunrealtype tmid;
  sunrealtype alpha;
  double local_88;
  double local_80;
  double local_78;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar6;
  int k;
  int iVar7;
  int iVar8;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar9;
  double local_30;
  double local_20;
  double local_18;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x2fb,"arkRootfind",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    puVar2 = *(undefined8 **)(in_RDI + 0x3d8);
    iVar8 = 0;
    local_30 = 0.0;
    bVar3 = false;
    iVar6 = 0;
    for (iVar9 = 0; iVar9 < *(int *)(puVar2 + 1); iVar9 = iVar9 + 1) {
      if (*(int *)(puVar2[0xe] + (long)iVar9 * 4) != 0) {
        dVar5 = ABS(*(double *)(puVar2[8] + (long)iVar9 * 8));
        if ((dVar5 != 0.0) || (NAN(dVar5))) {
          pdVar1 = (double *)(puVar2[7] + (long)iVar9 * 8);
          if (((((*pdVar1 <= 0.0 && *pdVar1 != 0.0) &&
                (0.0 < *(double *)(puVar2[8] + (long)iVar9 * 8))) ||
               ((0.0 < *(double *)(puVar2[7] + (long)iVar9 * 8) &&
                (pdVar1 = (double *)(puVar2[8] + (long)iVar9 * 8), *pdVar1 <= 0.0 && *pdVar1 != 0.0)
                ))) && ((double)*(int *)(puVar2[3] + (long)iVar9 * 4) *
                        *(double *)(puVar2[7] + (long)iVar9 * 8) <= 0.0)) &&
             (dVar5 = ABS(*(double *)(puVar2[8] + (long)iVar9 * 8) /
                          (*(double *)(puVar2[8] + (long)iVar9 * 8) -
                          *(double *)(puVar2[7] + (long)iVar9 * 8))), local_30 < dVar5)) {
            iVar6 = 1;
            iVar8 = iVar9;
            local_30 = dVar5;
          }
        }
        else if ((double)*(int *)(puVar2[3] + (long)iVar9 * 4) *
                 *(double *)(puVar2[7] + (long)iVar9 * 8) <= 0.0) {
          bVar3 = true;
        }
      }
    }
    if (iVar6 != 0) {
      local_18 = 1.0;
      iVar7 = 0;
      k = -1;
      while( true ) {
        while( true ) {
          if (ABS((double)puVar2[5] - (double)puVar2[4]) <= (double)puVar2[0xb]) goto LAB_00194057;
          if (k == iVar7) {
            if (iVar7 == 2) {
              local_78 = local_18 * 2.0;
            }
            else {
              local_78 = local_18 * 0.5;
            }
            local_18 = local_78;
          }
          else {
            local_18 = 1.0;
          }
          local_20 = (double)puVar2[5] -
                     (((double)puVar2[5] - (double)puVar2[4]) *
                     *(double *)(puVar2[8] + (long)iVar8 * 8)) /
                     (-local_18 * *(double *)(puVar2[7] + (long)iVar8 * 8) +
                     *(double *)(puVar2[8] + (long)iVar8 * 8));
          if (ABS(local_20 - (double)puVar2[4]) < (double)puVar2[0xb] * 0.5) {
            local_80 = ABS((double)puVar2[5] - (double)puVar2[4]) / (double)puVar2[0xb];
            if (local_80 <= 5.0) {
              local_80 = 0.5 / local_80;
            }
            else {
              local_80 = 0.1;
            }
            local_20 = local_80 * ((double)puVar2[5] - (double)puVar2[4]) + (double)puVar2[4];
          }
          if (ABS((double)puVar2[5] - local_20) < (double)puVar2[0xb] * 0.5) {
            local_88 = ABS((double)puVar2[5] - (double)puVar2[4]) / (double)puVar2[0xb];
            if (local_88 <= 5.0) {
              local_88 = 0.5 / local_88;
            }
            else {
              local_88 = 0.1;
            }
            local_20 = -local_88 * ((double)puVar2[5] - (double)puVar2[4]) + (double)puVar2[5];
          }
          ARKodeGetDky((void *)CONCAT44(iVar9,in_stack_ffffffffffffffb8),
                       (sunrealtype)CONCAT44(iVar8,iVar7),k,
                       (N_Vector)CONCAT44(iVar6,in_stack_ffffffffffffffa0));
          k = iVar7;
          iVar9 = (*(code *)*puVar2)(local_20,*(undefined8 *)(in_RDI + 0x248),puVar2[9],puVar2[0x10]
                                    );
          puVar2[0xd] = puVar2[0xd] + 1;
          if (iVar9 != 0) {
            return -0xc;
          }
          local_30 = 0.0;
          bVar3 = false;
          iVar6 = 0;
          for (iVar9 = 0; iVar9 < *(int *)(puVar2 + 1); iVar9 = iVar9 + 1) {
            if (*(int *)(puVar2[0xe] + (long)iVar9 * 4) != 0) {
              dVar5 = ABS(*(double *)(puVar2[9] + (long)iVar9 * 8));
              if ((dVar5 != 0.0) || (NAN(dVar5))) {
                pdVar1 = (double *)(puVar2[7] + (long)iVar9 * 8);
                if ((((*pdVar1 <= 0.0 && *pdVar1 != 0.0) &&
                     (0.0 < *(double *)(puVar2[9] + (long)iVar9 * 8))) ||
                    ((0.0 < *(double *)(puVar2[7] + (long)iVar9 * 8) &&
                     (pdVar1 = (double *)(puVar2[9] + (long)iVar9 * 8),
                     *pdVar1 <= 0.0 && *pdVar1 != 0.0)))) &&
                   (((double)*(int *)(puVar2[3] + (long)iVar9 * 4) *
                     *(double *)(puVar2[7] + (long)iVar9 * 8) <= 0.0 &&
                    (dVar5 = ABS(*(double *)(puVar2[9] + (long)iVar9 * 8) /
                                 (*(double *)(puVar2[9] + (long)iVar9 * 8) -
                                 *(double *)(puVar2[7] + (long)iVar9 * 8))), local_30 < dVar5)))) {
                  iVar6 = 1;
                  iVar8 = iVar9;
                  local_30 = dVar5;
                }
              }
              else if ((double)*(int *)(puVar2[3] + (long)iVar9 * 4) *
                       *(double *)(puVar2[7] + (long)iVar9 * 8) <= 0.0) {
                bVar3 = true;
              }
            }
          }
          in_stack_ffffffffffffffb8 = 0;
          if (iVar6 == 0) break;
          puVar2[5] = local_20;
          for (iVar9 = 0; iVar9 < *(int *)(puVar2 + 1); iVar9 = iVar9 + 1) {
            *(undefined8 *)(puVar2[8] + (long)iVar9 * 8) =
                 *(undefined8 *)(puVar2[9] + (long)iVar9 * 8);
          }
          iVar7 = 1;
          if (ABS((double)puVar2[5] - (double)puVar2[4]) <= (double)puVar2[0xb]) goto LAB_00194057;
        }
        if (bVar3) break;
        puVar2[4] = local_20;
        for (iVar9 = 0; iVar9 < *(int *)(puVar2 + 1); iVar9 = iVar9 + 1) {
          *(undefined8 *)(puVar2[7] + (long)iVar9 * 8) =
               *(undefined8 *)(puVar2[9] + (long)iVar9 * 8);
        }
        iVar7 = 2;
        if (ABS((double)puVar2[5] - (double)puVar2[4]) <= (double)puVar2[0xb]) goto LAB_00194057;
      }
      puVar2[5] = local_20;
      for (iVar8 = 0; iVar8 < *(int *)(puVar2 + 1); iVar8 = iVar8 + 1) {
        *(undefined8 *)(puVar2[8] + (long)iVar8 * 8) = *(undefined8 *)(puVar2[9] + (long)iVar8 * 8);
      }
LAB_00194057:
      puVar2[6] = puVar2[5];
      for (iVar8 = 0; iVar8 < *(int *)(puVar2 + 1); iVar8 = iVar8 + 1) {
        *(undefined8 *)(puVar2[9] + (long)iVar8 * 8) = *(undefined8 *)(puVar2[8] + (long)iVar8 * 8);
        *(undefined4 *)(puVar2[2] + (long)iVar8 * 4) = 0;
        if (*(int *)(puVar2[0xe] + (long)iVar8 * 4) != 0) {
          dVar5 = ABS(*(double *)(puVar2[8] + (long)iVar8 * 8));
          if (((dVar5 == 0.0) && (!NAN(dVar5))) &&
             ((double)*(int *)(puVar2[3] + (long)iVar8 * 4) *
              *(double *)(puVar2[7] + (long)iVar8 * 8) <= 0.0)) {
            uVar4 = 1;
            if (0.0 < *(double *)(puVar2[7] + (long)iVar8 * 8)) {
              uVar4 = 0xffffffff;
            }
            *(undefined4 *)(puVar2[2] + (long)iVar8 * 4) = uVar4;
          }
          pdVar1 = (double *)(puVar2[7] + (long)iVar8 * 8);
          if ((((*pdVar1 <= 0.0 && *pdVar1 != 0.0) &&
               (0.0 < *(double *)(puVar2[8] + (long)iVar8 * 8))) ||
              ((0.0 < *(double *)(puVar2[7] + (long)iVar8 * 8) &&
               (pdVar1 = (double *)(puVar2[8] + (long)iVar8 * 8), *pdVar1 <= 0.0 && *pdVar1 != 0.0))
              )) && ((double)*(int *)(puVar2[3] + (long)iVar8 * 4) *
                     *(double *)(puVar2[7] + (long)iVar8 * 8) <= 0.0)) {
            uVar4 = 1;
            if (0.0 < *(double *)(puVar2[7] + (long)iVar8 * 8)) {
              uVar4 = 0xffffffff;
            }
            *(undefined4 *)(puVar2[2] + (long)iVar8 * 4) = uVar4;
          }
        }
      }
      return 1;
    }
    puVar2[6] = puVar2[5];
    for (iVar8 = 0; iVar8 < *(int *)(puVar2 + 1); iVar8 = iVar8 + 1) {
      *(undefined8 *)(puVar2[9] + (long)iVar8 * 8) = *(undefined8 *)(puVar2[8] + (long)iVar8 * 8);
    }
    if (bVar3) {
      for (iVar8 = 0; iVar8 < *(int *)(puVar2 + 1); iVar8 = iVar8 + 1) {
        *(undefined4 *)(puVar2[2] + (long)iVar8 * 4) = 0;
        if (((*(int *)(puVar2[0xe] + (long)iVar8 * 4) != 0) &&
            (dVar5 = ABS(*(double *)(puVar2[8] + (long)iVar8 * 8)), dVar5 == 0.0)) && (!NAN(dVar5)))
        {
          uVar4 = 1;
          if (0.0 < *(double *)(puVar2[7] + (long)iVar8 * 8)) {
            uVar4 = 0xffffffff;
          }
          *(undefined4 *)(puVar2[2] + (long)iVar8 * 4) = uVar4;
        }
      }
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int arkRootfind(void* arkode_mem)
{
  sunrealtype alpha, tmid, gfrac, maxfrac, fracint, fracsub;
  int i, retval, imax, side, sideprev;
  sunbooleantype zroot, sgnchg;
  ARKodeMem ark_mem;
  ARKodeRootMem rootmem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  rootmem = ark_mem->root_mem;

  imax = 0;

  /* First check for change in sign in ghi or for a zero in ghi. */
  maxfrac = ZERO;
  zroot   = SUNFALSE;
  sgnchg  = SUNFALSE;
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    if (!rootmem->gactive[i]) { continue; }
    if (SUNRabs(rootmem->ghi[i]) == ZERO)
    {
      if (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO) { zroot = SUNTRUE; }
    }
    else
    {
      if ((DIFFERENT_SIGN(rootmem->glo[i], rootmem->ghi[i])) &&
          (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO))
      {
        gfrac = SUNRabs(rootmem->ghi[i] / (rootmem->ghi[i] - rootmem->glo[i]));
        if (gfrac > maxfrac)
        {
          sgnchg  = SUNTRUE;
          maxfrac = gfrac;
          imax    = i;
        }
      }
    }
  }

  /* If no sign change was found, reset trout and grout.  Then return
     ARK_SUCCESS if no zero was found, or set iroots and return RTFOUND.  */
  if (!sgnchg)
  {
    rootmem->trout = rootmem->thi;
    for (i = 0; i < rootmem->nrtfn; i++)
    {
      rootmem->grout[i] = rootmem->ghi[i];
    }
    if (!zroot) { return (ARK_SUCCESS); }
    for (i = 0; i < rootmem->nrtfn; i++)
    {
      rootmem->iroots[i] = 0;
      if (!rootmem->gactive[i]) { continue; }
      if (SUNRabs(rootmem->ghi[i]) == ZERO)
      {
        rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1 : 1;
      }
    }
    return (RTFOUND);
  }

  /* Initialize alpha to avoid compiler warning */
  alpha = ONE;

  /* A sign change was found.  Loop to locate nearest root. */
  side     = 0;
  sideprev = -1;
  for (;;)
  { /* Looping point */

    /* If interval size is already less than tolerance ttol, break. */
    if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol) { break; }

    /* Set weight alpha.
       On the first two passes, set alpha = 1.  Thereafter, reset alpha
       according to the side (low vs high) of the subinterval in which
       the sign change was found in the previous two passes.
       If the sides were opposite, set alpha = 1.
       If the sides were the same, then double alpha (if high side),
       or halve alpha (if low side).
       The next guess tmid is the secant method value if alpha = 1, but
       is closer to tlo if alpha < 1, and closer to thi if alpha > 1.    */
    if (sideprev == side) { alpha = (side == 2) ? alpha * TWO : alpha * HALF; }
    else { alpha = ONE; }

    /* Set next root approximation tmid and get g(tmid).
       If tmid is too close to tlo or thi, adjust it inward,
       by a fractional distance that is between 0.1 and 0.5.  */
    tmid = rootmem->thi - (rootmem->thi - rootmem->tlo) * rootmem->ghi[imax] /
                            (rootmem->ghi[imax] - alpha * rootmem->glo[imax]);
    if (SUNRabs(tmid - rootmem->tlo) < HALF * rootmem->ttol)
    {
      fracint = SUNRabs(rootmem->thi - rootmem->tlo) / rootmem->ttol;
      fracsub = (fracint > FIVE) ? TENTH : HALF / fracint;
      tmid    = rootmem->tlo + fracsub * (rootmem->thi - rootmem->tlo);
    }
    if (SUNRabs(rootmem->thi - tmid) < HALF * rootmem->ttol)
    {
      fracint = SUNRabs(rootmem->thi - rootmem->tlo) / rootmem->ttol;
      fracsub = (fracint > FIVE) ? TENTH : HALF / fracint;
      tmid    = rootmem->thi - fracsub * (rootmem->thi - rootmem->tlo);
    }

    (void)ARKodeGetDky(ark_mem, tmid, 0, ark_mem->ycur);
    retval = rootmem->gfun(tmid, ark_mem->ycur, rootmem->grout,
                           rootmem->root_data);
    rootmem->nge++;
    if (retval != 0) { return (ARK_RTFUNC_FAIL); }

    /* Check to see in which subinterval g changes sign, and reset imax.
       Set side = 1 if sign change is on low side, or 2 if on high side.  */
    maxfrac  = ZERO;
    zroot    = SUNFALSE;
    sgnchg   = SUNFALSE;
    sideprev = side;
    for (i = 0; i < rootmem->nrtfn; i++)
    {
      if (!rootmem->gactive[i]) { continue; }
      if (SUNRabs(rootmem->grout[i]) == ZERO)
      {
        if (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO) { zroot = SUNTRUE; }
      }
      else
      {
        if ((DIFFERENT_SIGN(rootmem->glo[i], rootmem->grout[i])) &&
            (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO))
        {
          gfrac =
            SUNRabs(rootmem->grout[i] / (rootmem->grout[i] - rootmem->glo[i]));
          if (gfrac > maxfrac)
          {
            sgnchg  = SUNTRUE;
            maxfrac = gfrac;
            imax    = i;
          }
        }
      }
    }
    if (sgnchg)
    {
      /* Sign change found in (tlo,tmid); replace thi with tmid. */
      rootmem->thi = tmid;
      for (i = 0; i < rootmem->nrtfn; i++)
      {
        rootmem->ghi[i] = rootmem->grout[i];
      }
      side = 1;
      /* Stop at root thi if converged; otherwise loop. */
      if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol) { break; }
      continue; /* Return to looping point. */
    }

    if (zroot)
    {
      /* No sign change in (tlo,tmid), but g = 0 at tmid; return root tmid. */
      rootmem->thi = tmid;
      for (i = 0; i < rootmem->nrtfn; i++)
      {
        rootmem->ghi[i] = rootmem->grout[i];
      }
      break;
    }

    /* No sign change in (tlo,tmid), and no zero at tmid.
       Sign change must be in (tmid,thi).  Replace tlo with tmid. */
    rootmem->tlo = tmid;
    for (i = 0; i < rootmem->nrtfn; i++)
    {
      rootmem->glo[i] = rootmem->grout[i];
    }
    side = 2;
    /* Stop at root thi if converged; otherwise loop back. */
    if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol) { break; }

  } /* End of root-search loop */

  /* Reset trout and grout, set iroots, and return RTFOUND. */
  rootmem->trout = rootmem->thi;
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    rootmem->grout[i]  = rootmem->ghi[i];
    rootmem->iroots[i] = 0;
    if (!rootmem->gactive[i]) { continue; }
    if ((SUNRabs(rootmem->ghi[i]) == ZERO) &&
        (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO))
    {
      rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1 : 1;
    }
    if ((DIFFERENT_SIGN(rootmem->glo[i], rootmem->ghi[i])) &&
        (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO))
    {
      rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1 : 1;
    }
  }
  return (RTFOUND);
}